

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001c2f50 = 0x2e2e2e2e2e2e2e;
    uRam00000000001c2f57._0_1_ = '.';
    uRam00000000001c2f57._1_1_ = '.';
    uRam00000000001c2f57._2_1_ = '.';
    uRam00000000001c2f57._3_1_ = '.';
    uRam00000000001c2f57._4_1_ = '.';
    uRam00000000001c2f57._5_1_ = '.';
    uRam00000000001c2f57._6_1_ = '.';
    uRam00000000001c2f57._7_1_ = '.';
    DAT_001c2f40 = '.';
    DAT_001c2f40_1._0_1_ = '.';
    DAT_001c2f40_1._1_1_ = '.';
    DAT_001c2f40_1._2_1_ = '.';
    DAT_001c2f40_1._3_1_ = '.';
    DAT_001c2f40_1._4_1_ = '.';
    DAT_001c2f40_1._5_1_ = '.';
    DAT_001c2f40_1._6_1_ = '.';
    uRam00000000001c2f48 = 0x2e2e2e2e2e2e2e;
    DAT_001c2f4f = 0x2e;
    DAT_001c2f30 = '.';
    DAT_001c2f30_1._0_1_ = '.';
    DAT_001c2f30_1._1_1_ = '.';
    DAT_001c2f30_1._2_1_ = '.';
    DAT_001c2f30_1._3_1_ = '.';
    DAT_001c2f30_1._4_1_ = '.';
    DAT_001c2f30_1._5_1_ = '.';
    DAT_001c2f30_1._6_1_ = '.';
    uRam00000000001c2f38._0_1_ = '.';
    uRam00000000001c2f38._1_1_ = '.';
    uRam00000000001c2f38._2_1_ = '.';
    uRam00000000001c2f38._3_1_ = '.';
    uRam00000000001c2f38._4_1_ = '.';
    uRam00000000001c2f38._5_1_ = '.';
    uRam00000000001c2f38._6_1_ = '.';
    uRam00000000001c2f38._7_1_ = '.';
    DAT_001c2f20 = '.';
    DAT_001c2f20_1._0_1_ = '.';
    DAT_001c2f20_1._1_1_ = '.';
    DAT_001c2f20_1._2_1_ = '.';
    DAT_001c2f20_1._3_1_ = '.';
    DAT_001c2f20_1._4_1_ = '.';
    DAT_001c2f20_1._5_1_ = '.';
    DAT_001c2f20_1._6_1_ = '.';
    uRam00000000001c2f28._0_1_ = '.';
    uRam00000000001c2f28._1_1_ = '.';
    uRam00000000001c2f28._2_1_ = '.';
    uRam00000000001c2f28._3_1_ = '.';
    uRam00000000001c2f28._4_1_ = '.';
    uRam00000000001c2f28._5_1_ = '.';
    uRam00000000001c2f28._6_1_ = '.';
    uRam00000000001c2f28._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001c2f18._0_1_ = '.';
    uRam00000000001c2f18._1_1_ = '.';
    uRam00000000001c2f18._2_1_ = '.';
    uRam00000000001c2f18._3_1_ = '.';
    uRam00000000001c2f18._4_1_ = '.';
    uRam00000000001c2f18._5_1_ = '.';
    uRam00000000001c2f18._6_1_ = '.';
    uRam00000000001c2f18._7_1_ = '.';
    DAT_001c2f5f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}